

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_corofile.cpp
# Opt level: O3

void test_seq_read_write<(coro_io::execution_type)2>(string_view filename)

{
  atomic<unsigned_long> *paVar1;
  size_type *psVar2;
  ulong uVar3;
  io_context_pool *piVar4;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy;
  Lazy<std::pair<std::error_code,_unsigned_long>_> *lazy_00;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __l;
  string_view buf_00;
  string str;
  size_t size;
  char buf [100];
  basic_seq_coro_file<(coro_io::execution_type)2> file;
  undefined1 local_340 [8];
  undefined1 local_338 [32];
  basic_executor_type<std::allocator<void>,_0UL> local_318;
  undefined1 local_310 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2f8 [7];
  basic_seq_coro_file<(coro_io::execution_type)2> local_288;
  
  psVar2 = &local_288.executor_wrapper_.super_Executor._name._M_string_length;
  local_288.executor_wrapper_.super_Executor._vptr_Executor = (_func_int **)psVar2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_288,filename._M_str,filename._M_str + filename._M_len);
  __l._M_len = 1;
  __l._M_array = (iterator)&local_288;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)(local_310 + 0x18),__l,(allocator_type *)local_338);
  create_files((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)(local_310 + 0x18),0xbe);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)(local_310 + 0x18));
  if (local_288.executor_wrapper_.super_Executor._vptr_Executor != (_func_int **)psVar2) {
    operator_delete(local_288.executor_wrapper_.super_Executor._vptr_Executor,
                    local_288.executor_wrapper_.super_Executor._name._M_string_length + 1);
  }
  std::thread::hardware_concurrency();
  piVar4 = coro_io::g_block_io_context_pool<coro_io::io_context_pool>(0);
  LOCK();
  paVar1 = &piVar4->next_io_context_;
  uVar3 = (paVar1->super___atomic_base<unsigned_long>)._M_i;
  (paVar1->super___atomic_base<unsigned_long>)._M_i =
       (paVar1->super___atomic_base<unsigned_long>)._M_i + 1;
  UNLOCK();
  local_2f8[0]._0_8_ =
       *(size_type *)
        ((long)(piVar4->executors).
               super__Vector_base<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>,_std::allocator<std::unique_ptr<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start
               [uVar3 % (ulong)((long)(piVar4->io_contexts_).
                                      super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                                (long)(piVar4->io_contexts_).
                                      super__Vector_base<std::shared_ptr<asio::io_context>,_std::allocator<std::shared_ptr<asio::io_context>_>_>
                                      ._M_impl.super__Vector_impl_data._M_start >> 4)]._M_t.
               super___uniq_ptr_impl<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>,_std::default_delete<coro_io::ExecutorWrapper<asio::io_context::basic_executor_type<std::allocator<void>,_0UL>_>_>_>
               ._M_t + 0x28);
  coro_io::basic_seq_coro_file<(coro_io::execution_type)2>::basic_seq_coro_file
            (&local_288,filename,_S_out|_S_in,(executor_type *)(local_310 + 0x18));
  local_2f8[0]._0_8_ = &local_288;
  test_seq_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            ((anon_class_8_1_898ba27a *)(local_310 + 0x18));
  local_2f8[0]._0_8_ = &local_288;
  test_seq_read_write<(coro_io::execution_type)2>::anon_class_8_1_898ba27a::operator()
            ((anon_class_8_1_898ba27a *)(local_310 + 0x18));
  coro_io::basic_seq_coro_file<(coro_io::execution_type)2>::async_read
            ((basic_seq_coro_file<(coro_io::execution_type)2> *)local_310,(char *)&local_288,
             (size_t)(local_310 + 0x18));
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((pair<std::error_code,_unsigned_long> *)local_338,(coro *)local_310,lazy);
  local_318.target_ = local_338._16_8_;
  if ((_func_int **)local_310._0_8_ != (_func_int **)0x0) {
    (**(_func_int **)(local_310._0_8_ + 8))();
  }
  local_338._0_8_ = &local_318;
  test_seq_read_write<(coro_io::execution_type)2>::anon_class_8_1_89918cff::operator()
            ((anon_class_8_1_89918cff *)local_338);
  local_338._0_8_ = local_338 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_338,"test","");
  buf_00._M_str = (char *)local_338._8_8_;
  buf_00._M_len = (size_t)&local_288;
  coro_io::basic_seq_coro_file<(coro_io::execution_type)2>::async_write
            ((basic_seq_coro_file<(coro_io::execution_type)2> *)local_340,buf_00);
  async_simple::coro::syncAwait<async_simple::coro::Lazy<std::pair<std::error_code,unsigned_long>>>
            ((pair<std::error_code,_unsigned_long> *)local_310,(coro *)local_340,lazy_00);
  local_318.target_ = local_310._16_8_;
  if (local_340 != (undefined1  [8])0x0) {
    (**(_func_int **)((long)local_340 + 8))();
  }
  local_310._0_8_ = &local_318;
  test_seq_read_write<(coro_io::execution_type)2>::anon_class_8_1_89918cff::operator()
            ((anon_class_8_1_89918cff *)local_310);
  if ((undefined1 *)local_338._0_8_ != local_338 + 0x10) {
    operator_delete((void *)local_338._0_8_,local_338._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.file_path_._M_dataplus._M_p != &local_288.file_path_.field_2) {
    operator_delete(local_288.file_path_._M_dataplus._M_p,
                    local_288.file_path_.field_2._M_allocated_capacity + 1);
  }
  std::fstream::~fstream(&local_288.frw_seq_file_);
  local_288.executor_wrapper_.super_Executor._vptr_Executor = (_func_int **)&PTR__Executor_00163ed8;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_288.executor_wrapper_.super_Executor._name._M_dataplus._M_p !=
      &local_288.executor_wrapper_.super_Executor._name.field_2) {
    operator_delete(local_288.executor_wrapper_.super_Executor._name._M_dataplus._M_p,
                    local_288.executor_wrapper_.super_Executor._name.field_2._M_allocated_capacity +
                    1);
  }
  return;
}

Assistant:

void test_seq_read_write(std::string_view filename) {
  create_files({std::string(filename)}, 190);
  coro_io::basic_seq_coro_file<execute_type> file(filename,
                                                  std::ios::in | std::ios::out);
  CHECK(file.is_open());
#if defined(ENABLE_FILE_IO_URING) || defined(ASIO_WINDOWS)
  if (execute_type == coro_io::execution_type::native_async) {
    CHECK(file.get_execution_type() == coro_io::execution_type::native_async);
  }
#else
  CHECK(file.get_execution_type() == coro_io::execution_type::thread_pool);
#endif
  char buf[100];
  std::error_code ec;
  size_t size;
  std::tie(ec, size) = async_simple::coro::syncAwait(file.async_read(buf, 10));
  CHECK(size == 10);

  std::string str = "test";
  std::tie(ec, size) = async_simple::coro::syncAwait(file.async_write(str));
  CHECK(size == 4);
}